

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O2

_Bool test_mul(void)

{
  uint8_t **B_00;
  uint8_t **__return_storage_ptr__;
  uint8_t **__return_storage_ptr___00;
  int iVar1;
  uint8_t mask;
  uint8_t mask_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  uint uVar2;
  uint8_t local_1f8 [8];
  undefined8 uStack_1f0;
  uint8_t local_1e8 [8];
  undefined8 uStack_1e0;
  uint8_t local_1d8 [8];
  undefined8 uStack_1d0;
  uint8_t local_1c8 [8];
  undefined8 uStack_1c0;
  uint8_t local_1b8 [40];
  undefined8 uStack_190;
  uint8_t local_188 [24];
  undefined8 uStack_170;
  uint8_t local_168 [40];
  undefined8 uStack_140;
  uint8_t local_138 [56];
  undefined1 local_100 [8];
  m256v ApB;
  m256v R1;
  m256v AC;
  m256v BC;
  m256v R2;
  m256v C;
  m256v A;
  m256v B;
  
  uVar2 = 0;
  do {
    if (uVar2 == 1000) {
LAB_00102194:
      return 999 < uVar2;
    }
    uStack_140 = 0x101ffd;
    rand_coeffs(local_138,0x23,(uint8_t)in_RDX);
    uStack_140 = 0x102015;
    m256v_make((m256v *)&C.e,5,7,local_138);
    uStack_170 = 0x102028;
    rand_coeffs(local_168,0x23,mask);
    uStack_170 = 0x102039;
    m256v_make((m256v *)&A.e,5,7,local_168);
    uStack_190 = 0x10204c;
    rand_coeffs(local_188,0x15,mask_00);
    uStack_190 = 0x102062;
    m256v_make((m256v *)&R2.e,7,3,local_188);
    uStack_1c0 = 0x10207e;
    m256v_make((m256v *)local_100,5,7,local_1b8);
    uStack_1c0 = 0x10208e;
    m256v_add((m256v *)&C.e,(m256v *)&A.e,(m256v *)local_100);
    uStack_1d0 = 0x1020ad;
    m256v_make((m256v *)&ApB.e,5,3,local_1c8);
    B_00 = &R2.e;
    uStack_1d0 = 0x1020bf;
    m256v_mul((m256v *)local_100,(m256v *)B_00,(m256v *)&ApB.e);
    __return_storage_ptr__ = &R1.e;
    uStack_1e0 = 0x1020de;
    m256v_make((m256v *)__return_storage_ptr__,5,3,local_1d8);
    uStack_1e0 = 0x1020ed;
    m256v_mul((m256v *)&C.e,(m256v *)B_00,(m256v *)__return_storage_ptr__);
    __return_storage_ptr___00 = &AC.e;
    uStack_1f0 = 0x102109;
    m256v_make((m256v *)__return_storage_ptr___00,5,3,local_1e8);
    uStack_1f0 = 0x102118;
    m256v_mul((m256v *)&A.e,(m256v *)B_00,(m256v *)__return_storage_ptr___00);
    m256v_make((m256v *)&BC.e,5,3,local_1f8);
    m256v_add((m256v *)__return_storage_ptr__,(m256v *)__return_storage_ptr___00,(m256v *)&BC.e);
    iVar1 = bcmp(local_1c8,local_1f8,0xf);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d:  Multiplication is not distributive.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
              ,0x188);
      goto LAB_00102194;
    }
    uVar2 = uVar2 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

static bool test_mul()
{
	/* Random checks:  Verify distributivity */

	/* We verify the identity (A + B)*C = A*C + B*C */
	for (int i = 0; i < 1000; ++i) {
		const int dim1 = 5, dim2 = 7, dim3 = 3;

		/* Create matrices */
		Def_mat256_rand(A, a, dim1, dim2, 0xff)
		Def_mat256_rand(B, b, dim1, dim2, 0xff)
		Def_mat256_rand(C, c, dim2, dim3, 0xff)

		/* Compute R1 := (A + B)*C */
		m256v_Def(ApB, apb, dim1, dim2)
		m256v_add(&A, &B, &ApB);
		m256v_Def(R1, r1, dim1, dim3)
		m256v_mul(&ApB, &C, &R1);

		/* Compute R2 := A*C + B*C */
		m256v_Def(AC, ac, dim1, dim3)
		m256v_mul(&A, &C, &AC);
		m256v_Def(BC, bc, dim1, dim3)
		m256v_mul(&B, &C, &BC);
		m256v_Def(R2, r2, dim1, dim3)
		m256v_add(&AC, &BC, &R2);

		/* Make sure R1 = R2 */
		if (memcmp(r1, r2, sizeof(r2)) != 0) {
			fprintf(stderr,
			  "%s:%d:  Multiplication is not distributive.\n",
			  __FILE__, __LINE__);
			return false;
		}
	}

	return true;
}